

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::DataTypeExpression::fromSyntax
          (Compilation *compilation,DataTypeSyntax *syntax,ASTContext *context)

{
  Symbol *pSVar1;
  Type *pTVar2;
  DataTypeSyntax *pDVar3;
  bool bVar4;
  Type *pTVar5;
  bool local_79;
  SourceRange local_78;
  SourceRange local_68;
  DiagCode local_54;
  bitmask<slang::ast::ASTFlags> local_50;
  SourceRange local_48;
  bitmask<slang::ast::ASTFlags> local_38;
  Type *local_30;
  Type *type;
  ASTContext *context_local;
  DataTypeSyntax *syntax_local;
  Compilation *compilation_local;
  
  type = (Type *)context;
  context_local = (ASTContext *)syntax;
  syntax_local = (DataTypeSyntax *)compilation;
  local_30 = Compilation::getType(compilation,syntax,context,(Type *)0x0);
  local_79 = false;
  if (context_local->lookupIndex == 0x1c6) {
    pSVar1 = &type->super_Symbol;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_38,AllowTypeReferences);
    local_79 = bitmask<slang::ast::ASTFlags>::has
                         ((bitmask<slang::ast::ASTFlags> *)&(pSVar1->name)._M_str,&local_38);
  }
  pDVar3 = syntax_local;
  if (local_79 == false) {
    pSVar1 = &type->super_Symbol;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_50,AllowDataType);
    bVar4 = bitmask<slang::ast::ASTFlags>::has
                      ((bitmask<slang::ast::ASTFlags> *)&(pSVar1->name)._M_str,&local_50);
    pDVar3 = syntax_local;
    pTVar5 = type;
    pTVar2 = local_30;
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      local_78 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
      compilation_local =
           (Compilation *)
           BumpAllocator::
           emplace<slang::ast::DataTypeExpression,slang::ast::Type_const&,slang::SourceRange>
                     ((BumpAllocator *)pDVar3,pTVar2,&local_78);
    }
    else {
      local_54.subsystem = General;
      local_54.code = 1;
      local_68 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
      ASTContext::addDiag((ASTContext *)pTVar5,local_54,local_68);
      compilation_local =
           (Compilation *)Expression::badExpr((Compilation *)syntax_local,(Expression *)0x0);
    }
  }
  else {
    pTVar5 = Compilation::getTypeRefType((Compilation *)syntax_local);
    pTVar2 = local_30;
    local_48 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
    compilation_local =
         (Compilation *)
         BumpAllocator::
         emplace<slang::ast::TypeReferenceExpression,slang::ast::Type_const&,slang::ast::Type_const&,slang::SourceRange>
                   ((BumpAllocator *)pDVar3,pTVar5,pTVar2,&local_48);
  }
  return (Expression *)compilation_local;
}

Assistant:

Expression& DataTypeExpression::fromSyntax(Compilation& compilation, const DataTypeSyntax& syntax,
                                           const ASTContext& context) {
    const Type& type = compilation.getType(syntax, context);
    if (syntax.kind == SyntaxKind::TypeReference &&
        context.flags.has(ASTFlags::AllowTypeReferences)) {
        return *compilation.emplace<TypeReferenceExpression>(compilation.getTypeRefType(), type,
                                                             syntax.sourceRange());
    }

    if (!context.flags.has(ASTFlags::AllowDataType)) {
        context.addDiag(diag::ExpectedExpression, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    return *compilation.emplace<DataTypeExpression>(type, syntax.sourceRange());
}